

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListView.cpp
# Opt level: O3

QList<QColor> * __thiscall
QColorListView::selectedColors(QList<QColor> *__return_storage_ptr__,QColorListView *this)

{
  QAbstractItemModel *pQVar1;
  QForeachContainer<QList<QModelIndex>_> _container_102;
  QModelIndexList indexes;
  QArrayDataPointer<QModelIndex> local_b8;
  QModelIndex *local_a0;
  QModelIndex *local_98;
  undefined4 local_90;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined8 local_70;
  QArrayDataPointer<QModelIndex> local_60;
  QArrayDataPointer<char16_t> local_48;
  QColor local_30;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::selectedRows((int)&local_60);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QColor *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_b8.d = local_60.d;
  local_b8.ptr = local_60.ptr;
  local_b8.size = local_60.size;
  if (local_60.d != (Data *)0x0) {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a0 = local_60.ptr;
  local_98 = local_60.ptr + local_60.size;
  local_90 = 1;
  if (local_60.size != 0) {
    do {
      pQVar1 = (local_60.ptr)->m;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_88.shared = (PrivateShared *)0x0;
        local_88._8_8_ = 0;
        local_88._16_8_ = 0;
        local_70 = 2;
        local_a0 = local_60.ptr;
      }
      else {
        local_a0 = local_60.ptr;
        (**(code **)(*(long *)pQVar1 + 0x90))(&local_88,pQVar1,local_60.ptr,0x100);
      }
      QVariant::toString();
      QColor::setNamedColor((QString *)&local_30);
      QtPrivate::QMovableArrayOps<QColor>::emplace<QColor>
                ((QMovableArrayOps<QColor> *)__return_storage_ptr__,(__return_storage_ptr__->d).size
                 ,&local_30);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QVariant::~QVariant((QVariant *)&local_88);
      local_60.ptr = local_a0 + 1;
      local_a0 = local_60.ptr;
    } while (local_60.ptr != local_98);
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_60);
  return __return_storage_ptr__;
}

Assistant:

QList<QColor> QColorListView::selectedColors() const {
    const QModelIndexList indexes = selectionModel()->selectedRows();
    QList<QColor> colors;

    foreach (const QModelIndex &index, indexes) {
        colors << QColor(index.data(static_cast<int>(QColorListModel::Role::HexArgbName)).toString());
    }

    return colors;
}